

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvq.cc
# Opt level: O0

int main(int argc,char **argv)

{
  value_type pcVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  size_type sVar5;
  reference ppcVar6;
  ostream *poVar7;
  istream *input_stream;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_9;
  ostringstream error_message_8;
  vector<int,_std::allocator<int>_> codebook_indices;
  vector<double,_std::allocator<double>_> input_vector;
  ostringstream error_message_7;
  Buffer buffer;
  MultistageVectorQuantization multistage_vector_quantization;
  istream *stream_for_input_vectors;
  ostringstream error_message_6;
  ifstream ifs;
  char *input_vectors_file;
  ostringstream error_message_5;
  int num_input_files;
  vector<double,_std::allocator<double>_> tmp;
  ostringstream error_message_4;
  ifstream ifs_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  codebook;
  int n;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  codebook_vectors;
  int length;
  ostringstream error_message_3;
  ostringstream error_message_2;
  int num_stage;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  vector<const_char_*,_std::allocator<const_char_*>_> codebook_vectors_file;
  int num_order;
  option *in_stack_ffffffffffffe8b8;
  int *in_stack_ffffffffffffe8c0;
  string *in_stack_ffffffffffffe8c8;
  allocator *paVar8;
  undefined4 in_stack_ffffffffffffe8d0;
  int in_stack_ffffffffffffe8d4;
  size_type in_stack_ffffffffffffe8d8;
  undefined6 in_stack_ffffffffffffe8e0;
  undefined1 in_stack_ffffffffffffe8e6;
  undefined1 in_stack_ffffffffffffe8e7;
  int *actual_write_size;
  istream *in_stack_ffffffffffffe8f8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe900;
  vector<double,_std::allocator<double>_> *sequence_to_read;
  undefined8 in_stack_ffffffffffffe908;
  int in_stack_ffffffffffffe910;
  undefined1 in_stack_ffffffffffffe916;
  char *local_16e8;
  undefined7 in_stack_ffffffffffffe920;
  undefined1 in_stack_ffffffffffffe927;
  undefined7 in_stack_ffffffffffffe938;
  byte in_stack_ffffffffffffe93f;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffe940;
  undefined4 in_stack_ffffffffffffe948;
  _Ios_Openmode in_stack_ffffffffffffe94c;
  vector<double,_std::allocator<double>_> *input_vector_00;
  MultistageVectorQuantization *in_stack_ffffffffffffe958;
  bool local_1632;
  bool local_1612;
  allocator local_15f1;
  string local_15f0 [32];
  ostringstream local_15d0 [120];
  ostringstream *in_stack_ffffffffffffeaa8;
  string *in_stack_ffffffffffffeab0;
  allocator local_1451;
  string local_1450 [32];
  ostringstream local_1430 [383];
  int local_12b1 [8];
  vector<double,_std::allocator<double>_> local_1291;
  allocator local_1271;
  string local_1270 [32];
  ostringstream local_1250 [408];
  MultistageVectorQuantization local_10b8;
  char *local_1070;
  allocator local_1061;
  string local_1060 [32];
  ostringstream local_1040 [376];
  char local_ec8 [520];
  vector<double,_std::allocator<double>_> *local_cc0;
  allocator local_cb1;
  string local_cb0 [32];
  ostringstream local_c90 [376];
  int local_b18;
  allocator local_af1;
  string local_af0 [32];
  ostringstream local_ad0 [376];
  char local_958 [548];
  int local_734;
  int local_718;
  allocator local_711;
  string local_710 [32];
  ostringstream local_6f0 [383];
  allocator local_571;
  string local_570 [32];
  ostringstream local_550 [376];
  int local_3d8;
  allocator local_3d1;
  string local_3d0 [32];
  ostringstream local_3b0 [383];
  allocator local_231;
  string local_230 [32];
  int local_210;
  allocator local_209;
  string local_208 [32];
  ostringstream local_1e8 [383];
  allocator local_69;
  string local_68 [52];
  int local_34;
  vector<const_char_*,_std::allocator<const_char_*>_> local_30;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x103779);
LAB_00103779:
  local_34 = ya_getopt_long(in_stack_ffffffffffffe8d4,(char **)in_stack_ffffffffffffe8c8,
                            (char *)in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
                            (int *)0x10379c);
  pcVar2 = ya_optarg;
  if (local_34 == -1) {
    sVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_30);
    local_3d8 = (int)sVar5;
    if (local_3d8 == 0) {
      std::__cxx11::ostringstream::ostringstream(local_550);
      std::operator<<((ostream *)local_550,"One or more -s options are required");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_570,"msvq",&local_571);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
      std::__cxx11::string::~string(local_570);
      std::allocator<char>::~allocator((allocator<char> *)&local_571);
      local_4 = 1;
      local_210 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_550);
      goto LAB_00104d92;
    }
    bVar3 = sptk::SetBinaryMode();
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream(local_6f0);
      std::operator<<((ostream *)local_6f0,"Cannot set translation mode");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_710,"msvq",&local_711);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
      std::__cxx11::string::~string(local_710);
      std::allocator<char>::~allocator((allocator<char> *)&local_711);
      local_4 = 1;
      local_210 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_6f0);
      goto LAB_00104d92;
    }
    local_718 = local_14 + 1;
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              *)0x103fa9);
    local_734 = 0;
    goto LAB_00103fb4;
  }
  switch(local_34) {
  case 0x68:
    anon_unknown.dwarf_4fcc::PrintUsage
              ((ostream *)
               CONCAT17(in_stack_ffffffffffffe8e7,
                        CONCAT16(in_stack_ffffffffffffe8e6,in_stack_ffffffffffffe8e0)));
    local_4 = 0;
    local_210 = 1;
    goto LAB_00104d92;
  default:
    anon_unknown.dwarf_4fcc::PrintUsage
              ((ostream *)
               CONCAT17(in_stack_ffffffffffffe8e7,
                        CONCAT16(in_stack_ffffffffffffe8e6,in_stack_ffffffffffffe8e0)));
    local_4 = 1;
    local_210 = 1;
    goto LAB_00104d92;
  case 0x6c:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar2,&local_69);
    bVar3 = sptk::ConvertStringToInteger(in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c0);
    local_1612 = !bVar3 || local_14 < 1;
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    if (local_1612) {
      std::__cxx11::ostringstream::ostringstream(local_1e8);
      std::operator<<((ostream *)local_1e8,
                      "The argument for the -l option must be a positive integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_208,"msvq",&local_209);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      local_4 = 1;
      local_210 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1e8);
      goto LAB_00104d92;
    }
    local_14 = local_14 + -1;
    goto LAB_00103779;
  case 0x6d:
    goto switchD_00103812_caseD_6d;
  case 0x73:
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
               (value_type *)in_stack_ffffffffffffe8c8);
    goto LAB_00103779;
  }
LAB_00103fb4:
  if (local_3d8 <= local_734) goto LAB_0010439a;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x103fd5);
  std::ifstream::ifstream(local_958);
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&local_30,(long)local_734);
  pcVar1 = *ppcVar6;
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_958,(_Ios_Openmode)pcVar1);
  bVar4 = std::ios::fail();
  if ((bVar4 & 1) == 0) {
    std::allocator<double>::allocator((allocator<double> *)0x10420f);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffe8e7,
                        CONCAT16(in_stack_ffffffffffffe8e6,in_stack_ffffffffffffe8e0)),
               in_stack_ffffffffffffe8d8,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0));
    std::allocator<double>::~allocator((allocator<double> *)0x10423b);
    while (bVar3 = sptk::ReadStream<double>
                             ((bool)in_stack_ffffffffffffe916,in_stack_ffffffffffffe910,
                              (int)((ulong)in_stack_ffffffffffffe908 >> 0x20),
                              (int)in_stack_ffffffffffffe908,in_stack_ffffffffffffe900,
                              in_stack_ffffffffffffe8f8,
                              (int *)CONCAT17(in_stack_ffffffffffffe927,in_stack_ffffffffffffe920)),
          bVar3) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
                  (value_type *)in_stack_ffffffffffffe8c8);
    }
    std::ifstream::close();
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0));
    local_210 = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_ad0);
    poVar7 = std::operator<<((ostream *)local_ad0,"Cannot open file ");
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&local_30,(long)local_734);
    std::operator<<(poVar7,*ppcVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_af0,"msvq",&local_af1);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
    std::__cxx11::string::~string(local_af0);
    std::allocator<char>::~allocator((allocator<char> *)&local_af1);
    local_4 = 1;
    local_210 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_ad0);
  }
  std::ifstream::~ifstream(local_958);
  if (local_210 == 0) {
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::push_back((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0),
                (value_type *)in_stack_ffffffffffffe8c8);
    local_210 = 0;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0));
  if (local_210 != 0) goto LAB_00104d74;
  local_734 = local_734 + 1;
  goto LAB_00103fb4;
switchD_00103812_caseD_6d:
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,pcVar2,&local_231);
  bVar3 = sptk::ConvertStringToInteger(in_stack_ffffffffffffe8c8,in_stack_ffffffffffffe8c0);
  local_1632 = !bVar3 || local_14 < 0;
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  if (local_1632) goto LAB_00103b1a;
  goto LAB_00103779;
LAB_00103b1a:
  std::__cxx11::ostringstream::ostringstream(local_3b0);
  poVar7 = std::operator<<((ostream *)local_3b0,"The argument for the -m option must be a ");
  std::operator<<(poVar7,"non-negative integer");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"msvq",&local_3d1);
  sptk::PrintErrorMessage(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  local_4 = 1;
  local_210 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_3b0);
  goto LAB_00104d92;
LAB_0010439a:
  local_b18 = local_8 - ya_optind;
  if (local_b18 < 2) {
    if (local_b18 == 0) {
      input_vector_00 = (vector<double,_std::allocator<double>_> *)0x0;
    }
    else {
      input_vector_00 =
           *(vector<double,_std::allocator<double>_> **)(local_10 + (long)ya_optind * 8);
    }
    local_cc0 = input_vector_00;
    std::ifstream::ifstream(local_ec8);
    if (local_cc0 == (vector<double,_std::allocator<double>_> *)0x0) {
LAB_00104720:
      bVar4 = std::ifstream::is_open();
      if ((bVar4 & 1) == 0) {
        local_16e8 = (char *)&std::cin;
      }
      else {
        local_16e8 = local_ec8;
      }
      local_1070 = local_16e8;
      sptk::MultistageVectorQuantization::MultistageVectorQuantization
                ((MultistageVectorQuantization *)
                 CONCAT17(in_stack_ffffffffffffe8e7,
                          CONCAT16(in_stack_ffffffffffffe8e6,in_stack_ffffffffffffe8e0)),
                 (int)(in_stack_ffffffffffffe8d8 >> 0x20),(int)in_stack_ffffffffffffe8d8);
      sptk::MultistageVectorQuantization::Buffer::Buffer((Buffer *)0x104791);
      bVar3 = sptk::MultistageVectorQuantization::IsValid(&local_10b8);
      if (bVar3) {
        input_stream = (istream *)(long)local_718;
        sequence_to_read = &local_1291;
        std::allocator<double>::allocator((allocator<double> *)0x10491c);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_ffffffffffffe8e7,
                            CONCAT16(in_stack_ffffffffffffe8e6,in_stack_ffffffffffffe8e0)),
                   in_stack_ffffffffffffe8d8,
                   (allocator_type *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0));
        std::allocator<double>::~allocator((allocator<double> *)0x104942);
        actual_write_size = local_12b1;
        std::allocator<int>::allocator((allocator<int> *)0x104961);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffe8e7,
                            CONCAT16(in_stack_ffffffffffffe8e6,in_stack_ffffffffffffe8e0)),
                   in_stack_ffffffffffffe8d8,
                   (allocator_type *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0));
        std::allocator<int>::~allocator((allocator<int> *)0x104987);
        do {
          bVar3 = sptk::ReadStream<double>
                            ((bool)in_stack_ffffffffffffe916,in_stack_ffffffffffffe910,
                             (int)((ulong)in_stack_ffffffffffffe908 >> 0x20),
                             (int)in_stack_ffffffffffffe908,sequence_to_read,input_stream,
                             (int *)CONCAT17(bVar4,in_stack_ffffffffffffe920));
          if (!bVar3) {
            local_4 = 0;
            local_210 = 1;
            goto LAB_00104ce6;
          }
          bVar3 = sptk::MultistageVectorQuantization::Run
                            (in_stack_ffffffffffffe958,input_vector_00,
                             (vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                              *)CONCAT44(in_stack_ffffffffffffe94c,in_stack_ffffffffffffe948),
                             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe940,
                             (Buffer *)CONCAT17(in_stack_ffffffffffffe93f,in_stack_ffffffffffffe938)
                            );
          if (!bVar3) {
            std::__cxx11::ostringstream::ostringstream(local_1430);
            std::operator<<((ostream *)local_1430,"Failed to quantize vector");
            paVar8 = &local_1451;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1450,"msvq",paVar8);
            sptk::PrintErrorMessage(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
            std::__cxx11::string::~string(local_1450);
            std::allocator<char>::~allocator((allocator<char> *)&local_1451);
            local_4 = 1;
            local_210 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1430);
            goto LAB_00104ce6;
          }
          bVar3 = sptk::WriteStream<int>
                            (in_stack_ffffffffffffe910,
                             (int)((ulong)in_stack_ffffffffffffe908 >> 0x20),
                             (vector<int,_std::allocator<int>_> *)sequence_to_read,
                             (ostream *)input_stream,actual_write_size);
          in_stack_ffffffffffffe8d4 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffe8d4);
        } while (bVar3);
        std::__cxx11::ostringstream::ostringstream(local_15d0);
        std::operator<<((ostream *)local_15d0,"Failed to write codebook index");
        paVar8 = &local_15f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_15f0,"msvq",paVar8);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
        std::__cxx11::string::~string(local_15f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_15f1);
        local_4 = 1;
        local_210 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_15d0);
LAB_00104ce6:
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0));
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0));
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1250);
        std::operator<<((ostream *)local_1250,"Failed to initialize MultistageVectorQuantization");
        paVar8 = &local_1271;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1270,"msvq",paVar8);
        sptk::PrintErrorMessage(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
        std::__cxx11::string::~string(local_1270);
        std::allocator<char>::~allocator((allocator<char> *)&local_1271);
        local_4 = 1;
        local_210 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1250);
      }
      sptk::MultistageVectorQuantization::Buffer::~Buffer((Buffer *)0x104d2b);
      sptk::MultistageVectorQuantization::~MultistageVectorQuantization
                ((MultistageVectorQuantization *)0x104d38);
    }
    else {
      in_stack_ffffffffffffe940 = local_cc0;
      in_stack_ffffffffffffe94c = std::operator|(_S_in,_S_bin);
      std::ifstream::open(local_ec8,(_Ios_Openmode)in_stack_ffffffffffffe940);
      in_stack_ffffffffffffe93f = std::ios::fail();
      if ((in_stack_ffffffffffffe93f & 1) == 0) goto LAB_00104720;
      std::__cxx11::ostringstream::ostringstream(local_1040);
      poVar7 = std::operator<<((ostream *)local_1040,"Cannot open file ");
      std::operator<<(poVar7,(char *)local_cc0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1060,"msvq",&local_1061);
      sptk::PrintErrorMessage(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
      std::__cxx11::string::~string(local_1060);
      std::allocator<char>::~allocator((allocator<char> *)&local_1061);
      local_4 = 1;
      local_210 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1040);
    }
    std::ifstream::~ifstream(local_ec8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_c90);
    std::operator<<((ostream *)local_c90,"Too many input files");
    paVar8 = &local_cb1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cb0,"msvq",paVar8);
    sptk::PrintErrorMessage(in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
    std::__cxx11::string::~string(local_cb0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
    local_4 = 1;
    local_210 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_c90);
  }
LAB_00104d74:
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0));
LAB_00104d92:
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             CONCAT44(in_stack_ffffffffffffe8d4,in_stack_ffffffffffffe8d0));
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  std::vector<const char*> codebook_vectors_file;

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:s:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("msvq", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("msvq", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        codebook_vectors_file.push_back(optarg);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_stage(static_cast<int>(codebook_vectors_file.size()));
  if (0 == num_stage) {
    std::ostringstream error_message;
    error_message << "One or more -s options are required";
    sptk::PrintErrorMessage("msvq", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("msvq", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<std::vector<std::vector<double> > > codebook_vectors;
  for (int n(0); n < num_stage; ++n) {
    std::vector<std::vector<double> > codebook;
    {
      std::ifstream ifs;
      ifs.open(codebook_vectors_file[n], std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << codebook_vectors_file[n];
        sptk::PrintErrorMessage("msvq", error_message);
        return 1;
      }

      std::vector<double> tmp(length);
      while (sptk::ReadStream(false, 0, 0, length, &tmp, &ifs, NULL)) {
        codebook.push_back(tmp);
      }
      ifs.close();
    }
    codebook_vectors.push_back(codebook);
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("msvq", error_message);
    return 1;
  }
  const char* input_vectors_file(0 == num_input_files ? NULL : argv[optind]);

  std::ifstream ifs;
  if (NULL != input_vectors_file) {
    ifs.open(input_vectors_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_vectors_file;
      sptk::PrintErrorMessage("msvq", error_message);
      return 1;
    }
  }
  std::istream& stream_for_input_vectors(ifs.is_open() ? ifs : std::cin);

  sptk::MultistageVectorQuantization multistage_vector_quantization(num_order,
                                                                    num_stage);
  sptk::MultistageVectorQuantization::Buffer buffer;
  if (!multistage_vector_quantization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize MultistageVectorQuantization";
    sptk::PrintErrorMessage("msvq", error_message);
    return 1;
  }

  std::vector<double> input_vector(length);
  std::vector<int> codebook_indices(num_stage);

  while (sptk::ReadStream(false, 0, 0, length, &input_vector,
                          &stream_for_input_vectors, NULL)) {
    if (!multistage_vector_quantization.Run(input_vector, codebook_vectors,
                                            &codebook_indices, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to quantize vector";
      sptk::PrintErrorMessage("msvq", error_message);
      return 1;
    }
    if (!sptk::WriteStream(0, num_stage, codebook_indices, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write codebook index";
      sptk::PrintErrorMessage("msvq", error_message);
      return 1;
    }
  }

  return 0;
}